

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O2

bool __thiscall
binlog::SessionWriter::
addEvent<boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,deque<int,_void,_void> *args,
          list<int,_void> *args_1,slist<int,_void> *args_2,vector<int,_void,_void> *args_3)

{
  size_t size;
  QueueWriter *this_00;
  char **ppcVar1;
  char *pcVar2;
  Queue *pQVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  size_t sizes [6];
  
  sizes[0] = 8;
  sizes[1] = 8;
  sizes[2] = mserialize::detail::BuiltinSerializer<boost::container::deque<int,_void,_void>,_void>::
             serialized_size(args);
  sizes[3] = mserialize::detail::BuiltinSerializer<boost::container::list<int,_void>,_void>::
             serialized_size(args_1);
  sizes[4] = mserialize::detail::BuiltinSerializer<boost::container::slist<int,_void>,_void>::
             serialized_size(args_2);
  sizes[5] = (args_3->m_holder).m_size * 4 + 4;
  lVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 8) {
    lVar6 = lVar6 + *(long *)((long)sizes + lVar5);
  }
  size = lVar6 + 4;
  this_00 = &this->_qw;
  bVar4 = detail::QueueWriter::beginWrite(this_00,size);
  if (!bVar4) {
    replaceChannel(this,size);
    bVar4 = detail::QueueWriter::beginWrite(this_00,size);
    if (!bVar4) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar6;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 4;
  *(uint64_t *)(pcVar2 + 4) = eventSourceId;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 8;
  *(uint64_t *)(pcVar2 + 8) = clock;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 8;
  mserialize::detail::BuiltinSerializer<boost::container::deque<int,_void,_void>,_void>::
  serialize<binlog::detail::QueueWriter>(args,this_00);
  mserialize::detail::BuiltinSerializer<boost::container::list<int,_void>,_void>::
  serialize<binlog::detail::QueueWriter>(args_1,this_00);
  mserialize::detail::BuiltinSerializer<boost::container::slist<int,_void>,_void>::
  serialize<binlog::detail::QueueWriter>(args_2,this_00);
  mserialize::detail::BuiltinSerializer<boost::container::vector<int,_void,_void>,_void>::
  serialize<binlog::detail::QueueWriter>(args_3,this_00);
  pQVar3 = (this->_qw)._queue;
  (pQVar3->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar3->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}